

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

void HandleActorFlag(FScanner *sc,Baggage *bag,char *part1,char *part2,int mod)

{
  AActor *actor;
  FFlagDef *fd_00;
  AActor *defaults;
  FFlagDef *fd;
  int mod_local;
  char *part2_local;
  char *part1_local;
  Baggage *bag_local;
  FScanner *sc_local;
  
  fd_00 = FindFlag(&bag->Info->super_PClass,part1,part2);
  if (fd_00 == (FFlagDef *)0x0) {
    if (part2 == (char *)0x0) {
      FScanner::ScriptMessage(sc,"\"%s\" is an unknown flag\n",part1);
    }
    else {
      FScanner::ScriptMessage(sc,"\"%s.%s\" is an unknown flag\n",part1,part2);
    }
    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  }
  else {
    actor = (AActor *)(bag->Info->super_PClass).Defaults;
    if (fd_00->structoffset == -1) {
      HandleDeprecatedFlags(actor,bag->Info,mod == 0x2b,fd_00->flagbit);
    }
    else {
      ModActorFlag(actor,fd_00,mod == 0x2b);
    }
  }
  return;
}

Assistant:

void HandleActorFlag(FScanner &sc, Baggage &bag, const char *part1, const char *part2, int mod)
{
	FFlagDef *fd;

	if ( (fd = FindFlag (bag.Info, part1, part2)) )
	{
		AActor *defaults = (AActor*)bag.Info->Defaults;
		if (fd->structoffset == -1)	// this is a deprecated flag that has been changed into a real property
		{
			HandleDeprecatedFlags(defaults, bag.Info, mod=='+', fd->flagbit);
		}
		else
		{
			ModActorFlag(defaults, fd, mod == '+');
		}
	}
	else
	{
		if (part2 == NULL)
		{
			sc.ScriptMessage("\"%s\" is an unknown flag\n", part1);
		}
		else
		{
			sc.ScriptMessage("\"%s.%s\" is an unknown flag\n", part1, part2);
		}
		FScriptPosition::ErrorCounter++;
	}
}